

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

exr_result_t exr_attr_string_init_static(exr_context_t ctxt,exr_attr_string_t *s,char *v)

{
  exr_result_t eVar1;
  size_t sVar2;
  
  if (v == (char *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = strlen(v);
    if (0x7ffffffe < sVar2) {
      if (ctxt == (exr_context_t)0x0) {
        return 2;
      }
      eVar1 = (**(code **)(ctxt + 0x40))(ctxt,3,"Invalid string too long for attribute");
      return eVar1;
    }
  }
  eVar1 = exr_attr_string_init_static_with_length(ctxt,s,v,(int32_t)sVar2);
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_string_init_static (
    exr_context_t ctxt, exr_attr_string_t* s, const char* v)
{
    size_t  fulllen = 0;
    int32_t length  = 0;

    if (v)
    {
        fulllen = strlen (v);
        if (fulllen >= (size_t) INT32_MAX)
        {
            INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);
            return pctxt->report_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid string too long for attribute");
        }
        length = (int32_t) fulllen;
    }
    return exr_attr_string_init_static_with_length (ctxt, s, v, length);
}